

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O3

wchar_t mapglyph(nh_dbuf_entry_conflict *dbe,curses_symdef_conflict *syms,wchar_t *bg_color)

{
  undefined8 *puVar1;
  ushort uVar2;
  curses_symdef_conflict *pcVar3;
  curses_symdef_conflict *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  curses_drawing_info *pcVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  wchar_t wVar13;
  curses_symdef_conflict *pcVar14;
  short sVar15;
  int iVar16;
  wchar_t wVar17;
  ulong uVar18;
  uint uVar19;
  ushort uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  wchar_t wVar25;
  
  pcVar8 = cur_drawing;
  wVar13 = dbe->effect;
  if (wVar13 == L'\0') {
    if (dbe->invis == '\0') {
      wVar13 = (wchar_t)dbe->mon;
      if (dbe->mon != 0) {
        if ((cur_drawing->num_monsters < wVar13) && ((dbe->monflags & 8) != 0)) {
          pcVar14 = cur_drawing->warnings + (~cur_drawing->num_monsters + wVar13);
        }
        else {
          pcVar14 = cur_drawing->monsters + (long)wVar13 + -1;
        }
        *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar14->unichar + 5);
        uVar21 = *(undefined4 *)&pcVar14->symname;
        uVar22 = *(undefined4 *)((long)&pcVar14->symname + 4);
        iVar16 = pcVar14->color;
        wVar13 = pcVar14->unichar[0];
        wVar17 = pcVar14->unichar[1];
        wVar23 = pcVar14->unichar[2];
        wVar24 = pcVar14->unichar[3];
        wVar25 = pcVar14->unichar[4];
        goto LAB_0011314e;
      }
      uVar18 = 0;
    }
    else {
      pcVar14 = cur_drawing->invis;
      *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar14->unichar + 5);
      uVar21 = *(undefined4 *)&pcVar14->symname;
      uVar22 = *(undefined4 *)((long)&pcVar14->symname + 4);
      iVar16 = pcVar14->color;
      wVar13 = pcVar14->unichar[0];
      wVar17 = pcVar14->unichar[1];
      wVar23 = pcVar14->unichar[2];
      wVar24 = pcVar14->unichar[3];
      wVar25 = pcVar14->unichar[4];
LAB_0011314e:
      syms->unichar[1] = wVar17;
      syms->unichar[2] = wVar23;
      syms->unichar[3] = wVar24;
      syms->unichar[4] = wVar25;
      *(undefined4 *)&syms->symname = uVar21;
      *(undefined4 *)((long)&syms->symname + 4) = uVar22;
      syms->color = iVar16;
      syms->unichar[0] = wVar13;
      uVar18 = 1;
      if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (syms->color != 0)) {
        syms->color = (uint)(7 < syms->color) * 8 + 7;
      }
    }
    pcVar8 = cur_drawing;
    if ((long)dbe->obj != 0) {
      lVar11 = (long)dbe->obj + -1;
      sVar15 = dbe->obj_mn;
      pcVar14 = syms + uVar18;
      pcVar4 = cur_drawing->objects;
      *(undefined8 *)(pcVar14->unichar + 5) = *(undefined8 *)(pcVar4[lVar11].unichar + 5);
      pcVar3 = pcVar4 + lVar11;
      pcVar5 = pcVar3->symname;
      iVar16 = pcVar3->color;
      wVar13 = pcVar3->unichar[0];
      uVar6 = *(undefined8 *)(pcVar4[lVar11].unichar + 1 + 2);
      *(undefined8 *)(pcVar14->unichar + 1) = *(undefined8 *)(pcVar4[lVar11].unichar + 1);
      *(undefined8 *)(pcVar14->unichar + 3) = uVar6;
      pcVar14->symname = pcVar5;
      pcVar14->color = iVar16;
      pcVar14->unichar[0] = wVar13;
      if (corpse_id == (wchar_t)lVar11) {
        pcVar14->color = pcVar8->monsters[(long)sVar15 + -1].color;
      }
      if ((dbe->objflags & 2) != 0) {
        pcVar14->color = 0xd;
      }
      if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (pcVar14->color != 0))
      {
        pcVar14->color = (uint)(7 < pcVar14->color) * 8 + 7;
      }
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
        darken_symdef(pcVar14);
      }
      uVar18 = (ulong)((int)uVar18 + 1);
    }
    if ((long)dbe->trap == 0) {
      if ((int)uVar18 != 0) goto LAB_00113302;
      sVar15 = dbe->bg;
      uVar18 = 0;
    }
    else {
      lVar11 = (long)dbe->trap + -1;
      pcVar14 = syms + uVar18;
      pcVar4 = cur_drawing->traps;
      *(undefined8 *)(pcVar14->unichar + 5) = *(undefined8 *)(pcVar4[lVar11].unichar + 5);
      pcVar3 = pcVar4 + lVar11;
      pcVar5 = pcVar3->symname;
      iVar16 = pcVar3->color;
      wVar13 = pcVar3->unichar[0];
      uVar6 = *(undefined8 *)(pcVar4[lVar11].unichar + 1 + 2);
      *(undefined8 *)(pcVar14->unichar + 1) = *(undefined8 *)(pcVar4[lVar11].unichar + 1);
      *(undefined8 *)(pcVar14->unichar + 3) = uVar6;
      pcVar14->symname = pcVar5;
      pcVar14->color = iVar16;
      pcVar14->unichar[0] = wVar13;
      if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (pcVar14->color != 0))
      {
        pcVar14->color = (uint)(7 < pcVar14->color) * 8 + 7;
      }
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
        darken_symdef(pcVar14);
      }
      if (((wchar_t)lVar11 == mportal_id) || ((wchar_t)lVar11 == vibsquare_id)) {
        *bg_color = L'\x01';
      }
      uVar18 = (ulong)((int)uVar18 + 1);
LAB_00113302:
      wVar17 = (wchar_t)uVar18;
      sVar15 = dbe->bg;
      wVar13 = (wchar_t)sVar15;
      if (wVar13 < cur_drawing->bg_feature_offset) goto LAB_00113537;
    }
    pcVar14 = syms + uVar18;
    pcVar4 = cur_drawing->bgelements;
    *(undefined8 *)(pcVar14->unichar + 5) = *(undefined8 *)(pcVar4[sVar15].unichar + 5);
    pcVar3 = pcVar4 + sVar15;
    pcVar5 = pcVar3->symname;
    iVar16 = pcVar3->color;
    wVar13 = pcVar3->unichar[0];
    uVar6 = *(undefined8 *)(pcVar4[sVar15].unichar + 1 + 2);
    *(undefined8 *)(pcVar14->unichar + 1) = *(undefined8 *)(pcVar4[sVar15].unichar + 1);
    *(undefined8 *)(pcVar14->unichar + 3) = uVar6;
    pcVar14->symname = pcVar5;
    pcVar14->color = iVar16;
    wVar17 = level_display_mode;
    pcVar14->unichar[0] = wVar13;
    if (settings.mapcolors != '\0') {
      wVar13 = (wchar_t)dbe->bg;
      switch(level_display_mode) {
      case L'\x01':
        if (vwall_id <= wVar13) {
          iVar16 = 9;
LAB_0011339f:
          if (wVar13 <= trwall_id) goto LAB_001133e7;
        }
        break;
      case L'\x03':
        if (((vwall_id <= wVar13) && (wVar13 <= trwall_id)) && ((dbe->dgnflags & 0x1f80U) == 0)) {
          iVar16 = 3;
LAB_001133e7:
          pcVar14->color = iVar16;
        }
        break;
      case L'\x04':
        if (vwall_id <= wVar13) {
          iVar16 = 0xc;
          goto LAB_0011339f;
        }
        break;
      case L'\a':
        iVar16 = 10;
        if ((room_id == wVar13) || (iVar16 = 2, darkroom_id == wVar13)) goto LAB_001133e7;
      }
      uVar2 = dbe->dgnflags;
      uVar20 = uVar2 & 0x1f80;
      if (uVar20 == 0x200) {
        if ((vwall_id <= wVar13) && (iVar16 = 0xd, wVar13 <= trwall_id)) goto LAB_001134a8;
      }
      else {
        if (uVar20 == 0x100) {
          iVar16 = 10;
          if (((wVar13 < vwall_id || trwall_id < wVar13) && (room_id != wVar13)) &&
             (ndoor_id != wVar13)) {
            iVar16 = 2;
LAB_00113488:
            if (darkroom_id != wVar13) goto LAB_001134ac;
          }
        }
        else {
          if (uVar20 != 0x80) goto LAB_001134ac;
          iVar16 = 0xb;
          if (((wVar13 < vwall_id || trwall_id < wVar13) && (room_id != wVar13)) &&
             (ndoor_id != wVar13)) {
            iVar16 = 3;
            goto LAB_00113488;
          }
        }
LAB_001134a8:
        pcVar14->color = iVar16;
      }
LAB_001134ac:
      if (((vcdoor_id == wVar13) || (hcdoor_id == wVar13)) &&
         ((iVar16 = 6, (uVar2 & 0x10) != 0 ||
          ((iVar16 = 1, (uVar2 & 4) != 0 || (iVar16 = 2, (uVar2 & 2) != 0)))))) {
        pcVar14->color = iVar16;
      }
      if (altar_id == wVar13) {
        iVar16 = 0xd;
        if (wVar17 != L'\x06') {
          switch(uVar2 & 0x60) {
          case 0:
            iVar16 = 1;
            break;
          case 0x20:
            iVar16 = 0xf;
            break;
          case 0x40:
            iVar16 = 7;
            break;
          case 0x60:
            iVar16 = 10;
            if ((uVar2 & 0x60) == 0x60) {
              iVar16 = 0;
            }
          }
        }
        pcVar14->color = iVar16;
      }
      if ((wVar17 == L'\b') && (pcVar14->color != 0)) {
        pcVar14->color = (uint)(7 < pcVar14->color) * 8 + 7;
      }
    }
    if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
      darken_symdef(pcVar14);
    }
    wVar17 = (int)uVar18 + L'\x01';
    wVar13 = (wchar_t)dbe->bg;
LAB_00113537:
    if (((((upstair_id == wVar13) || (dnstair_id == wVar13)) || (upladder_id == wVar13)) ||
        ((dnladder_id == wVar13 || (upsstair_id == wVar13)))) || (dnsstair_id == wVar13)) {
      *bg_color = L'\x01';
    }
    if ((dbe->mon == 0) && (dbe->invis == '\0')) {
      return wVar17;
    }
    *bg_color = L'\0';
    return wVar17;
  }
  if (4 < (uint)(wVar13 >> 0x10)) goto LAB_001130de;
  uVar12 = wVar13 + L'\xffff';
  uVar9 = uVar12 & 0xffff;
  switch(wVar13 >> 0x10) {
  case L'\0':
    pcVar3 = cur_drawing->explsyms;
    uVar19 = (uVar12 & 0xffff) / 9;
    uVar9 = uVar12 + uVar19 * -9 & 0xffff;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar3[uVar9].unichar + 5);
    pcVar14 = pcVar3 + uVar9;
    pcVar5 = pcVar14->symname;
    iVar16 = pcVar14->color;
    wVar13 = pcVar14->unichar[0];
    uVar6 = *(undefined8 *)(pcVar3[uVar9].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar3[uVar9].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar6;
    syms->symname = pcVar5;
    syms->color = iVar16;
    syms->unichar[0] = wVar13;
    piVar10 = &pcVar8->expltypes[uVar19].color;
    break;
  case L'\x01':
    pcVar3 = cur_drawing->swallowsyms;
    uVar12 = uVar12 & 7;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar3[uVar12].unichar + 5);
    pcVar14 = pcVar3 + uVar12;
    pcVar5 = pcVar14->symname;
    iVar16 = pcVar14->color;
    wVar13 = pcVar14->unichar[0];
    uVar6 = *(undefined8 *)(pcVar3[uVar12].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar3[uVar12].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar6;
    syms->symname = pcVar5;
    syms->color = iVar16;
    syms->unichar[0] = wVar13;
    pcVar14 = pcVar8->monsters;
    uVar9 = uVar9 >> 3;
    goto LAB_001130cc;
  case L'\x02':
    pcVar14 = cur_drawing->zapsyms;
    goto LAB_0011306d;
  case L'\x03':
    pcVar14 = cur_drawing->breathsyms;
LAB_0011306d:
    uVar12 = uVar12 & 3;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar14[uVar12].unichar + 5);
    pcVar3 = pcVar14 + uVar12;
    pcVar5 = pcVar3->symname;
    iVar16 = pcVar3->color;
    wVar13 = pcVar3->unichar[0];
    uVar6 = *(undefined8 *)(pcVar14[uVar12].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar14[uVar12].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar6;
    syms->symname = pcVar5;
    syms->color = iVar16;
    syms->unichar[0] = wVar13;
    pcVar14 = pcVar8->zaptypes;
    uVar9 = uVar9 >> 2;
LAB_001130cc:
    piVar10 = &pcVar14[uVar9].color;
    break;
  case L'\x04':
    pcVar14 = cur_drawing->effects;
    lVar11 = (ulong)(uVar9 << 3) * 5;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)((long)pcVar14->unichar + lVar11 + 0x14);
    puVar1 = (undefined8 *)((long)pcVar14->unichar + lVar11 + -0xc);
    pcVar5 = (char *)*puVar1;
    uVar6 = puVar1[1];
    puVar1 = (undefined8 *)((long)pcVar14->unichar + lVar11 + 4);
    uVar7 = puVar1[1];
    *(undefined8 *)(syms->unichar + 1) = *puVar1;
    *(undefined8 *)(syms->unichar + 3) = uVar7;
    syms->symname = pcVar5;
    syms->color = (int)uVar6;
    syms->unichar[0] = (int)((ulong)uVar6 >> 0x20);
    piVar10 = (int *)((long)pcVar8->effects->unichar + lVar11 + -4);
  }
  syms->color = *piVar10;
LAB_001130de:
  if (((settings.mapcolors != '\0') && (level_display_mode == L'\b')) && (syms->color != 0)) {
    syms->color = (uint)(7 < syms->color) * 8 + 7;
  }
  return L'\x01';
}

Assistant:

int mapglyph(struct nh_dbuf_entry *dbe, struct curses_symdef *syms, int *bg_color)
{
    int id, count = 0;

    if (dbe->effect) {
	id = NH_EFFECT_ID(dbe->effect);

	switch (NH_EFFECT_TYPE(dbe->effect)) {
	    case E_EXPLOSION:
		syms[0] = cur_drawing->explsyms[id % NUMEXPCHARS];
		syms[0].color = cur_drawing->expltypes[id / NUMEXPCHARS].color;
		break;

	    case E_SWALLOW:
		syms[0] = cur_drawing->swallowsyms[id & 0x7];
		syms[0].color = cur_drawing->monsters[id >> 3].color;
		break;

	    case E_ZAP:
		syms[0] = cur_drawing->zapsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_BREATH:
		syms[0] = cur_drawing->breathsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_MISC:
		syms[0] = cur_drawing->effects[id];
		syms[0].color = cur_drawing->effects[id].color;
		break;
	}

	valley_symdef(&syms[0]);

	return 1; /* we don't want to show other glyphs under effects */
    }
    
    if (dbe->invis) {
	syms[count] = cur_drawing->invis[0];
	valley_symdef(&syms[count]);
	count++;
    } else if (dbe->mon) {
	if (dbe->mon > cur_drawing->num_monsters && (dbe->monflags & MON_WARNING)) {
	    id = dbe->mon - 1 - cur_drawing->num_monsters;
	    syms[count] = cur_drawing->warnings[id];
	} else {
	    id = dbe->mon - 1;
	    syms[count] = cur_drawing->monsters[id];
	}
	valley_symdef(&syms[count]);
	count++;
    }
    
    if (dbe->obj) {
	object_symdef(dbe->obj - 1, dbe->obj_mn - 1, &syms[count]);

	if (dbe->objflags & DOBJ_PRIZE)
	    syms[count].color = CLR_BRIGHT_MAGENTA;
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	count++;
    }
    
    if (dbe->trap) {
	id = dbe->trap - 1;
	syms[count] = cur_drawing->traps[id];

	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	if (id == mportal_id || id == vibsquare_id)
	    *bg_color = CLR_RED;

	count++;
    } 
    
    /* omit the background symbol from the list if it is boring */
    if (count == 0 || dbe->bg >= cur_drawing->bg_feature_offset) {
	syms[count] = cur_drawing->bgelements[dbe->bg];
	recolor_bg(dbe, &syms[count]);
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);
	count++;
    }

    if (dbe->bg == upstair_id  || dbe->bg == dnstair_id  ||
	dbe->bg == upladder_id || dbe->bg == dnladder_id ||
	dbe->bg == upsstair_id || dbe->bg == dnsstair_id) {
	*bg_color = CLR_RED;
    }

    /* monsters override background color, NAO-style */
    if (dbe->mon || dbe->invis)
	*bg_color = 0;

    return count; /* count <= 4 */
}